

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.cpp
# Opt level: O3

int duckdb_brotli::BrotliDecoderSetParameter
              (BrotliDecoderStateInternal *state,BrotliDecoderParameter p,uint32_t value)

{
  uint uVar1;
  uint uVar2;
  
  if (state->state != BROTLI_STATE_UNINITED) {
    return 0;
  }
  if (p == BROTLI_DECODER_PARAM_LARGE_WINDOW) {
    uVar1 = (uint)(value != 0) << 5;
    uVar2 = *(uint *)&state->field_0x304 & 0xffffffdf;
  }
  else {
    if (p != BROTLI_DECODER_PARAM_DISABLE_RING_BUFFER_REALLOCATION) {
      return 0;
    }
    uVar1 = (uint)(value == 0) << 4;
    uVar2 = *(uint *)&state->field_0x304 & 0xffffffef;
  }
  *(uint *)&state->field_0x304 = uVar2 | uVar1;
  return 1;
}

Assistant:

BROTLI_BOOL BrotliDecoderSetParameter(BrotliDecoderState *state, BrotliDecoderParameter p, uint32_t value) {
	if (state->state != BROTLI_STATE_UNINITED)
		return BROTLI_FALSE;
	switch (p) {
	case BROTLI_DECODER_PARAM_DISABLE_RING_BUFFER_REALLOCATION:
		state->canny_ringbuffer_allocation = !!value ? 0 : 1;
		return BROTLI_TRUE;

	case BROTLI_DECODER_PARAM_LARGE_WINDOW:
		state->large_window = TO_BROTLI_BOOL(!!value);
		return BROTLI_TRUE;

	default:
		return BROTLI_FALSE;
	}
}